

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_length_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls1)

{
  sexp psVar1;
  sexp psVar2;
  ulong uVar3;
  sexp psVar4;
  
  psVar2 = (sexp)&DAT_00000001;
  if ((((ulong)ls1 & 3) != 0) || (ls1->tag != 6)) {
    return psVar2;
  }
  psVar4 = (ls1->value).type.cpl;
  uVar3 = 0;
  do {
    if (((ulong)psVar4 & 3) != 0) {
LAB_0010eb9b:
      return (sexp)(((long)&psVar2->tag + uVar3) * 2 + 1);
    }
    if (((psVar4->tag != 6) || (psVar1 = (psVar4->value).type.cpl, ((ulong)psVar1 & 3) != 0)) ||
       (psVar1->tag != 6)) {
      uVar3 = (ulong)(psVar4->tag == 6);
      goto LAB_0010eb9b;
    }
    if (ls1 == psVar4) {
      return (sexp)&DAT_0000003e;
    }
    psVar2 = (sexp)((long)&psVar2->tag + 2);
    ls1 = (ls1->value).type.cpl;
    psVar4 = (psVar1->value).type.cpl;
  } while( true );
}

Assistant:

sexp sexp_length_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls1) {
  sexp ls2;
  sexp_uint_t res = 1;
  if (!sexp_pairp(ls1))
    return SEXP_ZERO;
  for (ls2=sexp_cdr(ls1); sexp_pairp(ls2) && sexp_pairp(sexp_cdr(ls2));
       res+=2, ls1=sexp_cdr(ls1), ls2=sexp_cddr(ls2))
    if (ls1 == ls2)
      return SEXP_FALSE;
  return sexp_make_fixnum(res + (sexp_pairp(ls2) ? 1 : 0));
}